

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.cpp
# Opt level: O0

void embree::storeSTB(Ref<embree::Image> *img,FileName *fileName)

{
  bool bVar1;
  value_type vVar2;
  runtime_error *this;
  reference pvVar3;
  long *in_RDI;
  Color4 c;
  int x;
  int y;
  float maxColor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  int channels;
  int height;
  int width;
  string ext;
  FileName *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  int in_stack_fffffffffffffd0c;
  allocator_type *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  int comp;
  undefined4 in_stack_fffffffffffffd20;
  int y_00;
  undefined4 in_stack_fffffffffffffd24;
  int x_00;
  char *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3c;
  undefined1 in_stack_fffffffffffffd3e;
  undefined1 in_stack_fffffffffffffd3f;
  string *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  float in_stack_fffffffffffffd54;
  float local_2a8;
  float in_stack_fffffffffffffd5c;
  float *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  long in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  float local_278;
  float local_274;
  float local_248;
  float local_244;
  string local_1f8 [32];
  string local_1d8 [36];
  undefined4 local_1b4;
  string local_1b0 [32];
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  float local_178;
  float local_174;
  float local_170 [2];
  int local_168;
  int local_164;
  undefined4 local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  int local_140;
  int local_13c;
  int local_138;
  string local_128 [32];
  string local_108 [40];
  long *local_e0;
  long *local_d8;
  long *local_d0;
  long *local_c8;
  long *local_c0;
  long *local_b8;
  long *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  float *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  float *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  float *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_10;
  float local_8;
  
  local_e0 = in_RDI;
  FileName::ext_abi_cxx11_
            ((FileName *)
             CONCAT17(in_stack_fffffffffffffd3f,
                      CONCAT16(in_stack_fffffffffffffd3e,
                               CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))));
  toLowerCase(in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_128);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                          (char *)in_stack_fffffffffffffcf8);
  local_2a8 = in_stack_fffffffffffffd54;
  if (((bVar1) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                               (char *)in_stack_fffffffffffffcf8),
      local_2a8 = in_stack_fffffffffffffd54, bVar1)) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (char *)in_stack_fffffffffffffcf8),
     local_2a8 = in_stack_fffffffffffffd54, bVar1)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Could not store image");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_b0 = local_e0;
  local_138 = (int)*(undefined8 *)(*local_e0 + 0x10);
  local_b8 = local_e0;
  local_13c = *(int *)(*local_e0 + 0x18);
  local_140 = 3;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x42c13a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),in_stack_fffffffffffffd10
            );
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x42c166);
  local_160 = 0x437f0000;
  for (local_164 = 0; local_164 < local_13c; local_164 = local_164 + 1) {
    for (local_168 = 0; local_168 < local_138; local_168 = local_168 + 1) {
      local_c0 = local_e0;
      (**(code **)(*(long *)*local_e0 + 0x20))
                (&local_178,(long *)*local_e0,(long)local_168,(long)local_164);
      local_68 = &local_178;
      local_50 = &zero;
      local_17c = 0;
      local_38 = &one;
      local_180 = 0x3f800000;
      local_70 = &local_17c;
      local_78 = &local_180;
      local_18 = 1.0;
      local_244 = local_18;
      if (local_178 < 1.0) {
        local_244 = local_178;
      }
      local_30 = 0.0;
      local_2c = local_244;
      local_248 = local_30;
      if (0.0 <= local_244) {
        local_248 = local_244;
      }
      local_c8 = local_e0;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_158,
                          ((long)local_164 * *(long *)(*local_e0 + 0x10) + (long)local_168) *
                          (long)local_140);
      *pvVar3 = (value_type)(int)(local_248 * 255.0);
      local_80 = &local_174;
      local_58 = &zero;
      local_184 = 0;
      local_40 = &one;
      local_188 = 0x3f800000;
      local_88 = &local_184;
      local_90 = &local_188;
      local_10 = 1.0;
      local_274 = local_10;
      if (local_174 < 1.0) {
        local_274 = local_174;
      }
      local_28 = 0.0;
      local_24 = local_274;
      local_278 = local_28;
      if (0.0 <= local_274) {
        local_278 = local_274;
      }
      in_stack_fffffffffffffd6c =
           CONCAT13((char)(int)(local_278 * 255.0),(int3)in_stack_fffffffffffffd6c);
      in_stack_fffffffffffffd70 = (long)local_164;
      local_d0 = local_e0;
      in_stack_fffffffffffffd78 = (char *)*local_e0;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_158,
                          (in_stack_fffffffffffffd70 * *(long *)(in_stack_fffffffffffffd78 + 0x10) +
                          (long)local_168) * (long)local_140 + 1);
      *pvVar3 = (value_type)((uint)in_stack_fffffffffffffd6c >> 0x18);
      in_stack_fffffffffffffd60 = local_170;
      local_60 = &zero;
      local_18c = 0;
      local_48 = &one;
      local_190 = 0x3f800000;
      local_a0 = &local_18c;
      local_a8 = &local_190;
      local_8 = 1.0;
      in_stack_fffffffffffffd5c = local_8;
      if (local_170[0] < 1.0) {
        in_stack_fffffffffffffd5c = local_170[0];
      }
      local_20 = 0.0;
      local_2a8 = in_stack_fffffffffffffd5c;
      if (in_stack_fffffffffffffd5c < 0.0) {
        local_2a8 = local_20;
      }
      vVar2 = (value_type)(int)(local_2a8 * 255.0);
      local_d8 = local_e0;
      local_98 = in_stack_fffffffffffffd60;
      local_1c = in_stack_fffffffffffffd5c;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_158,
                          ((long)local_164 * *(long *)(*local_e0 + 0x10) + (long)local_168) *
                          (long)local_140 + 2);
      *pvVar3 = vVar2;
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                          (char *)in_stack_fffffffffffffcf8);
  if (bVar1) {
    FileName::str_abi_cxx11_(in_stack_fffffffffffffcf8);
    std::__cxx11::string::c_str();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x42c88d);
    stbi_write_bmp((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (int)((ulong)in_stack_fffffffffffffd60 >> 0x20),(int)in_stack_fffffffffffffd60,
                   (int)in_stack_fffffffffffffd5c,
                   (void *)CONCAT44(local_2a8,in_stack_fffffffffffffd50));
    std::__cxx11::string::~string(local_1b0);
    local_1b4 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                            (char *)in_stack_fffffffffffffcf8);
    x_00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd24);
    if (bVar1) {
      FileName::str_abi_cxx11_(in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffd10 = (allocator_type *)std::__cxx11::string::c_str();
      comp = local_13c;
      y_00 = local_140;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x42c969);
      stbi_write_png(in_stack_fffffffffffffd28,x_00,y_00,comp,in_stack_fffffffffffffd10,
                     in_stack_fffffffffffffd0c);
      std::__cxx11::string::~string(local_1d8);
      local_1b4 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (char *)in_stack_fffffffffffffcf8);
      if (bVar1) {
        FileName::str_abi_cxx11_(in_stack_fffffffffffffcf8);
        std::__cxx11::string::c_str();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x42ca57);
        stbi_write_jpg(in_stack_fffffffffffffd78,(int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                       (int)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                       in_stack_fffffffffffffd60,(int)in_stack_fffffffffffffd5c);
        std::__cxx11::string::~string(local_1f8);
        local_1b4 = 1;
      }
      else {
        local_1b4 = 0;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd10);
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

void storeSTB(const Ref<Image>& img, const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());
    if (ext != "bmp" && ext != "png" && ext != "jpg") {
        THROW_RUNTIME_ERROR("Could not store image")
        return;
    }

    int width = int(img->width);
    int height = int(img->height);
    int channels = 3;
    std::vector<unsigned char> pixels(width*height*channels);
    const float maxColor = 255.f;
    for (int y = 0; y < height; y++)
    {
      for (int x = 0; x < width; x++)
      {
        Color4 c = img->get(x, y);
        pixels[(y*img->width+x)*channels+0] = (unsigned char)(clamp(c.r) * maxColor);
        pixels[(y*img->width+x)*channels+1] = (unsigned char)(clamp(c.g) * maxColor);
        pixels[(y*img->width+x)*channels+2] = (unsigned char)(clamp(c.b) * maxColor);
      }
    }

    if (ext == "bmp" ) { stbi_write_bmp(fileName.str().c_str(), width, height, channels, pixels.data());                    return; }
    if (ext == "png" ) { stbi_write_png(fileName.str().c_str(), width, height, channels, pixels.data(), width * channels);  return; }
    if (ext == "jpg" ) { stbi_write_jpg(fileName.str().c_str(), width, height, channels, pixels.data(), 100);               return; }
  }